

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_iflist.c
# Opt level: O0

csp_iface_t * csp_iflist_get_by_isdfl(csp_iface_t *ifc)

{
  csp_iface_t *ifc_local;
  
  if (ifc == (csp_iface_t *)0x0) {
    ifc_local = interfaces;
  }
  else {
    ifc_local = ifc->next;
  }
  while( true ) {
    if (ifc_local == (csp_iface_t *)0x0) {
      return (csp_iface_t *)0x0;
    }
    if (ifc_local->is_default == '\x01') break;
    ifc_local = ifc_local->next;
  }
  return ifc_local;
}

Assistant:

csp_iface_t * csp_iflist_get_by_isdfl(csp_iface_t * ifc) {

	/* Head of list */
	if (ifc == NULL) {
		ifc = interfaces;

	/* Otherwise, continue from user defined ifc */
	} else {
		ifc = ifc->next;
	}

	while (ifc) {

		if (ifc->is_default == 1) {
			return ifc;
		}

		ifc = ifc->next;
		continue;

	}

	return NULL;

}